

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

Token __thiscall slang::parsing::Lexer::lexStringLiteral(Lexer *this)

{
  char *pcVar1;
  byte *pbVar2;
  SmallVector<char,_40UL> *this_00;
  LanguageVersion LVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  DiagCode DVar7;
  int iVar8;
  Diagnostic *in_RAX;
  Diagnostic *pDVar9;
  undefined4 extraout_var;
  char cVar10;
  char cVar11;
  EVP_PKEY_CTX *in_RDX;
  char *pcVar12;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  EVP_PKEY_CTX *extraout_RDX_05;
  EVP_PKEY_CTX *extraout_RDX_06;
  EVP_PKEY_CTX *extraout_RDX_07;
  EVP_PKEY_CTX *extraout_RDX_08;
  EVP_PKEY_CTX *extraout_RDX_09;
  char *curr;
  DiagCode code;
  size_t sVar13;
  size_t offset;
  int i;
  long lVar14;
  bool alreadyErrored;
  Token TVar15;
  string_view arg;
  string_view arg_00;
  char c;
  uint32_t unicodeChar;
  char *local_40;
  undefined4 local_38;
  int unicodeLen;
  
  pcVar12 = this->sourceBuffer;
  if ((*pcVar12 == '\"') && (pcVar12[1] == '\"')) {
    if ((int)(this->options).languageVersion < 1) {
      pDVar9 = addDiag(this,(DiagCode)0x20001,(size_t)(pcVar12 + ~(ulong)this->originalBegin));
      LVar3 = (this->options).languageVersion;
      sVar13 = 9;
      if (LVar3 == Default) {
        pcVar12 = "1800-2017";
      }
      else if (LVar3 == v1800_2023) {
        pcVar12 = "1800-2023";
      }
      else {
        pcVar12 = "";
        sVar13 = 0;
      }
      arg._M_str = pcVar12;
      arg._M_len = sVar13;
      in_RAX = Diagnostic::operator<<(pDVar9,arg);
      pcVar12 = this->sourceBuffer;
      in_RDX = extraout_RDX;
    }
    pcVar12 = pcVar12 + 2;
    this->sourceBuffer = pcVar12;
    local_38 = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  }
  else {
    local_38 = 0;
  }
  (this->stringBuffer).super_SmallVectorBase<char>.len = 0;
  this_00 = &this->stringBuffer;
  alreadyErrored = false;
  do {
    offset = (long)pcVar12 - (long)this->originalBegin;
    c = *pcVar12;
    if (c == '\"') {
      pcVar1 = pcVar12 + 1;
      if ((char)local_38 == '\0') {
        this->sourceBuffer = pcVar1;
        goto LAB_0034359c;
      }
      if ((*pcVar1 == '\"') && (pcVar12[2] == '\"')) {
        this->sourceBuffer = pcVar12 + 3;
        goto LAB_0034359c;
      }
      this->sourceBuffer = pcVar1;
LAB_00343328:
      SmallVectorBase<char>::emplace_back<char_const&>(&this_00->super_SmallVectorBase<char>,&c);
      alreadyErrored = false;
      in_RDX = extraout_RDX_00;
    }
    else if (c == '\\') {
      pcVar1 = pcVar12 + 1;
      this->sourceBuffer = pcVar1;
      c = pcVar12[1];
      in_RDX = (EVP_PKEY_CTX *)CONCAT71((int7)((ulong)in_RDX >> 8),c);
      pbVar2 = (byte *)(pcVar12 + 2);
      this->sourceBuffer = (char *)pbVar2;
      if ((byte)c - 0x30 < 8) {
        uVar6 = (uint)(byte)(c - 0x30);
        c = *pbVar2;
        if ((c & 0xf8U) == 0x30) {
          this->sourceBuffer = pcVar12 + 3;
          uVar6 = (uint)(byte)(c - 0x30) + uVar6 * 8;
          c = pcVar12[3];
          if ((c & 0xf8U) == 0x30) {
            this->sourceBuffer = pcVar12 + 4;
            if (0x1f < uVar6) {
              addDiag(this,(DiagCode)0xd0002,offset);
              in_RDX = extraout_RDX_01;
              goto LAB_00343547;
            }
            uVar6 = (uint)(byte)(c - 0x30) + uVar6 * 8;
          }
        }
        _unicodeChar = CONCAT71(stack0xffffffffffffffb9,(char)uVar6);
LAB_0034353a:
        SmallVectorBase<char>::emplace_back<char>
                  (&this_00->super_SmallVectorBase<char>,(char *)&unicodeChar);
        in_RDX = extraout_RDX_08;
      }
      else if (c != 10) {
        if (c != 0xd) {
          if (c == 0x22) {
            _unicodeChar = CONCAT71(stack0xffffffffffffffb9,0x22);
          }
          else if (c == 0x5c) {
            _unicodeChar = CONCAT71(stack0xffffffffffffffb9,0x5c);
          }
          else if (c == 0x61) {
            _unicodeChar = CONCAT71(stack0xffffffffffffffb9,7);
          }
          else if (c == 0x66) {
            _unicodeChar = CONCAT71(stack0xffffffffffffffb9,0xc);
          }
          else if (c == 0x78) {
            c = *pbVar2;
            bVar4 = isHexDigit(c);
            if (bVar4) {
              pcVar12 = this->sourceBuffer;
              this->sourceBuffer = pcVar12 + 1;
              cVar11 = ((byte)c < 0x47) * ' ' + -0x57;
              if (c < ':') {
                cVar11 = -0x30;
              }
              cVar11 = cVar11 + c;
              c = pcVar12[1];
              bVar4 = isHexDigit(c);
              if (bVar4) {
                this->sourceBuffer = this->sourceBuffer + 1;
                cVar10 = ((byte)c < 0x47) * ' ' + -0x57;
                if (c < ':') {
                  cVar10 = -0x30;
                }
                cVar11 = cVar10 + c + cVar11 * '\x10';
              }
              _unicodeChar = CONCAT71(stack0xffffffffffffffb9,cVar11);
            }
            else {
              addDiag(this,(DiagCode)0x90002,offset);
              _unicodeChar = CONCAT71(stack0xffffffffffffffb9,0x78);
            }
          }
          else if (c == 0x74) {
            _unicodeChar = CONCAT71(stack0xffffffffffffffb9,9);
          }
          else if (c == 0x76) {
            _unicodeChar = CONCAT71(stack0xffffffffffffffb9,0xb);
          }
          else {
            if (c != 0x6e) {
              this->sourceBuffer = pcVar1;
              bVar5 = scanUTF8Char(this,alreadyErrored,&unicodeChar,&unicodeLen);
              in_RDX = extraout_RDX_05;
              bVar4 = true;
              if (bVar5) {
                bVar5 = isPrintableUnicode(unicodeChar);
                in_RDX = extraout_RDX_06;
                bVar4 = alreadyErrored;
                if (bVar5) {
                  DVar7.subsystem = Lexer;
                  DVar7.code = 0x15;
                  code.subsystem = Lexer;
                  code.code = 0x18;
                  if (c == '%') {
                    code = DVar7;
                  }
                  pDVar9 = addDiag(this,code,offset);
                  arg_00._M_len = (size_t)unicodeLen;
                  arg_00._M_str = pcVar1;
                  Diagnostic::operator<<(pDVar9,arg_00);
                  in_RDX = extraout_RDX_07;
                }
              }
              this->sourceBuffer = pcVar1;
              alreadyErrored = bVar4;
              goto LAB_00343547;
            }
            _unicodeChar = CONCAT71(stack0xffffffffffffffb9,10);
          }
          goto LAB_0034353a;
        }
        if (*pbVar2 == 10) {
          this->sourceBuffer = pcVar12 + 3;
        }
      }
    }
    else {
      if ((c == '\n' || c == '\r') && (char)local_38 == '\0') {
LAB_0034357c:
        addDiag(this,(DiagCode)0x70002,offset);
        in_RDX = extraout_RDX_09;
LAB_0034359c:
        iVar8 = SmallVectorBase<char>::copy
                          (&this_00->super_SmallVectorBase<char>,(EVP_PKEY_CTX *)this->alloc,in_RDX)
        ;
        local_40 = (char *)CONCAT44(extraout_var,iVar8);
        TVar15 = create<std::basic_string_view<char,std::char_traits<char>>>
                           (this,StringLiteral,
                            (basic_string_view<char,_std::char_traits<char>_> *)&unicodeChar);
        return TVar15;
      }
      if (c == '\0') {
        if (this->sourceEnd + -1 <= pcVar12) goto LAB_0034357c;
        this->errorCount = this->errorCount + 1;
        addDiag(this,(DiagCode)0x50002,offset);
        this->sourceBuffer = this->sourceBuffer + 1;
        in_RDX = extraout_RDX_02;
      }
      else {
        if (-1 < c) {
          this->sourceBuffer = pcVar12 + 1;
          goto LAB_00343328;
        }
        bVar4 = scanUTF8Char(this,alreadyErrored,&unicodeChar,&unicodeLen);
        in_RDX = extraout_RDX_03;
        for (lVar14 = 0; lVar14 < unicodeLen; lVar14 = lVar14 + 1) {
          SmallVectorBase<char>::emplace_back<char_const&>
                    (&this_00->super_SmallVectorBase<char>,pcVar12 + lVar14);
          in_RDX = extraout_RDX_04;
        }
        alreadyErrored = (bool)(alreadyErrored | !bVar4);
      }
    }
LAB_00343547:
    pcVar12 = this->sourceBuffer;
  } while( true );
}

Assistant:

Token Lexer::lexStringLiteral() {
    bool tripleQuoted = false;
    if (peek() == '"' && peek(1) == '"') {
        // New in v1800-2023: triple quoted string literals
        if (options.languageVersion < LanguageVersion::v1800_2023) {
            addDiag(diag::WrongLanguageVersion, currentOffset() - 1)
                << toString(options.languageVersion);
        }
        tripleQuoted = true;
        advance(2);
    }

    stringBuffer.clear();
    bool sawUTF8Error = false;
    while (true) {
        size_t offset = currentOffset();
        char c = peek();

        if (c == '\\') {
            advance();
            c = peek();
            advance();

            uint32_t charCode;
            switch (c) {
                    // clang-format off
                case 'n': stringBuffer.push_back('\n'); break;
                case 't': stringBuffer.push_back('\t'); break;
                case '\\': stringBuffer.push_back('\\'); break;
                case '"': stringBuffer.push_back('"'); break;
                case 'v': stringBuffer.push_back('\v'); break;
                case 'f': stringBuffer.push_back('\f'); break;
                case 'a': stringBuffer.push_back('\a'); break;
                case '\n': break;
                case '\r': consume('\n'); break;
                case '0': case '1': case '2': case '3':
                case '4': case '5': case '6': case '7':
                    // clang-format on
                    // octal character code
                    charCode = getDigitValue(c);
                    if (isOctalDigit(c = peek())) {
                        advance();
                        charCode = (charCode * 8) + getDigitValue(c);
                        if (isOctalDigit(c = peek())) {
                            advance();
                            charCode = (charCode * 8) + getDigitValue(c);
                            if (charCode > 255) {
                                addDiag(diag::OctalEscapeCodeTooBig, offset);
                                break;
                            }
                        }
                    }
                    stringBuffer.push_back((char)charCode);
                    break;
                case 'x':
                    c = peek();
                    if (!isHexDigit(c)) {
                        addDiag(diag::InvalidHexEscapeCode, offset);
                        stringBuffer.push_back('x');
                    }
                    else {
                        advance();
                        charCode = getHexDigitValue(c);
                        if (isHexDigit(c = peek())) {
                            advance();
                            charCode = (charCode * 16) + getHexDigitValue(c);
                        }
                        stringBuffer.push_back((char)charCode);
                    }
                    break;
                default: {
                    auto curr = --sourceBuffer;

                    uint32_t unicodeChar;
                    int unicodeLen;
                    if (scanUTF8Char(sawUTF8Error, &unicodeChar, unicodeLen)) {
                        if (isPrintableUnicode(unicodeChar)) {
                            // '\%' is not an actual escape code but other tools silently allow it
                            // and major UVM headers use it, so we'll issue a (fairly quiet) warning
                            // about it. Otherwise issue a louder warning (on by default).
                            DiagCode code = c == '%' ? diag::NonstandardEscapeCode
                                                     : diag::UnknownEscapeCode;
                            addDiag(code, offset) << std::string_view(curr, (size_t)unicodeLen);
                        }
                    }
                    else {
                        sawUTF8Error = true;
                    }

                    // Back up so that we handle this character as a normal char in the outer loop,
                    // regardless of whether it's valid or not.
                    sourceBuffer = curr;
                    break;
                }
            }
        }
        else if (c == '"') {
            if (tripleQuoted) {
                if (peek(1) == '"' && peek(2) == '"') {
                    advance(3);
                    break;
                }
                else {
                    advance();
                    stringBuffer.push_back(c);
                    sawUTF8Error = false;
                }
            }
            else {
                advance();
                break;
            }
        }
        else if (isNewline(c) && !tripleQuoted) {
            addDiag(diag::ExpectedClosingQuote, offset);
            break;
        }
        else if (c == '\0') {
            if (reallyAtEnd()) {
                addDiag(diag::ExpectedClosingQuote, offset);
                break;
            }

            // otherwise just error and ignore
            errorCount++;
            addDiag(diag::EmbeddedNull, offset);
            advance();
        }
        else if (isASCII(c)) {
            advance();
            stringBuffer.push_back(c);
            sawUTF8Error = false;
        }
        else {
            auto curr = sourceBuffer;

            uint32_t unused;
            int unicodeLen;
            sawUTF8Error |= !scanUTF8Char(sawUTF8Error, &unused, unicodeLen);

            // Regardless of whether the character sequence was valid or not
            // we want to add the bytes to the string, to allow for cases where
            // the source is actually something like latin-1 encoded. Ignoring the
            // warning and carrying on will do the right thing for them.
            for (int i = 0; i < unicodeLen; i++)
                stringBuffer.push_back(curr[i]);
        }
    }

    return create(TokenKind::StringLiteral, toStringView(stringBuffer.copy(alloc)));
}